

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O1

ebml_element *
CreateElement(anynode *Any,uint8_t *PossibleId,int8_t IdLength,ebml_context *Context,
             ebml_master *Parent,int ForProfile)

{
  fourcc_t fVar1;
  fourcc_t fVar2;
  ebml_element *peVar3;
  ebml_dummy *Dummy;
  
  if (Context != (ebml_context *)0x0) {
    fVar2 = Context->Id;
    fVar1 = EBML_IdFromBuffer(PossibleId,IdLength);
    if (fVar1 == fVar2) {
      peVar3 = (ebml_element *)NodeCreate(Any,Context->Class);
      if (peVar3 != (ebml_element *)0x0) {
        peVar3->Context = Context;
        (**(code **)((long)(peVar3->Base).Base.VMT + 0xb8))(peVar3,0,(ulong)Parent & 0xffffffff);
      }
    }
    else {
      peVar3 = (ebml_element *)NodeCreate(Any,0x55444245);
      if (peVar3 == (ebml_element *)0x0) {
        peVar3 = (ebml_element *)0x0;
      }
      else {
        peVar3->Context = &EBML_ContextDummy;
        (**(code **)((long)(peVar3->Base).Base.VMT + 0xb8))(peVar3,0,(ulong)Parent & 0xffffffff);
        peVar3[1].Base.Children = (nodetree *)(ebml_semantic *)0x0;
        peVar3[1].DataSize = (filepos_t)(ebml_semantic *)0x0;
        peVar3[1].Base.Parent = (nodetree *)0;
        peVar3[1].Base.Next = (nodetree *)"DummyElement";
        peVar3[1].Base.Base.Data = (nodedata *)0x55444245000000ff;
        peVar3[1].Base.Base.RefCount = 0;
        fVar2 = EBML_IdFromBuffer(PossibleId,IdLength);
        *(fourcc_t *)&peVar3[1].Base.Base.Data = fVar2;
        peVar3->Context = (ebml_context *)&peVar3[1].Base.Base.Data;
      }
    }
    return peVar3;
  }
  __assert_fail("Context!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                ,0xd1,
                "ebml_element *CreateElement(anynode *, const uint8_t *, int8_t, const ebml_context *, ebml_master *, int)"
               );
}

Assistant:

static ebml_element *CreateElement(anynode *Any, const uint8_t *PossibleId, int8_t IdLength, const ebml_context *Context, ebml_master *Parent, int ForProfile)
{
    ebml_element *Result;
    assert(Context!=NULL);
    if (EBML_IdMatch(PossibleId, IdLength, Context->Id))
    {
        Result = EBML_ElementCreate(Any,Context,0, ForProfile);
    }
    else
    {
        Result = EBML_ElementCreate(Any,&EBML_ContextDummy,0, ForProfile);
        if (Result!=NULL)
        {
            // Fill a temp context
            ebml_dummy *Dummy = (ebml_dummy*)Result;
            memcpy(&Dummy->DummyContext,&EBML_ContextDummy,sizeof(Dummy->DummyContext));
            Dummy->DummyContext.Id = EBML_IdFromBuffer(PossibleId,IdLength);
            Result->Context = &Dummy->DummyContext;
        }
    }
    if (Result && Parent)
    {
        assert(Node_IsPartOf(Parent,EBML_MASTER_CLASS));
        EBML_MasterAppend(Parent,Result);
    }
    return Result;
}